

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void testMultiPartSharedAttributes(string *tempDir)

{
  ostream *poVar1;
  BaseExc *e;
  exception *e_1;
  string fn;
  string *in_stack_00000540;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_38 [24];
  string *in_stack_ffffffffffffffe0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing multi part APIs : shared attributes, header... ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  anon_unknown.dwarf_179b00::testSharedAttributes(in_stack_ffffffffffffffe0);
  anon_unknown.dwarf_179b00::testHeaders(in_stack_00000540);
  poVar1 = std::operator<<((ostream *)&std::cout," ... ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testMultiPartSharedAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing multi part APIs : shared attributes, header... "
             << endl;

        random_reseed (1);

        std::string fn = tempDir + "imf_test_multipart_shared_attrs.exr";

        testSharedAttributes (fn);
        testHeaders (fn);

        cout << " ... ok\n" << endl;
    }
    catch (const IEX_NAMESPACE::BaseExc& e)
    {
        cerr << "ERROR -- caught IEX_NAMESPACE::BaseExc exception: "
             << e.what () << endl;
        assert (false);
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught std::exception exception: " << e.what ()
             << endl;
        assert (false);
    }
}